

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

path * __thiscall boost::filesystem::path::extension(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  path *ppVar2;
  long lVar3;
  long lVar4;
  size_type pos;
  undefined1 local_38 [8];
  path name;
  path *this_local;
  
  name.m_pathname.field_2._8_8_ = this;
  filename((path *)local_38,this);
  ppVar2 = detail::dot_path();
  bVar1 = operator==((path *)local_38,ppVar2);
  if (!bVar1) {
    ppVar2 = detail::dot_dot_path();
    bVar1 = operator==((path *)local_38,ppVar2);
    if (!bVar1) {
      lVar3 = std::__cxx11::string::rfind((char)local_38,0x2e);
      if (lVar3 == -1) {
        path(__return_storage_ptr__);
      }
      else {
        lVar4 = std::__cxx11::string::c_str();
        path(__return_storage_ptr__,(value_type *)(lVar4 + lVar3));
      }
      goto LAB_00119b22;
    }
  }
  path(__return_storage_ptr__);
LAB_00119b22:
  ~path((path *)local_38);
  return __return_storage_ptr__;
}

Assistant:

path path::extension() const
  {
    path name(filename());
    if (name == detail::dot_path() || name == detail::dot_dot_path()) return path();
    size_type pos(name.m_pathname.rfind(dot));
    return pos == string_type::npos
      ? path()
      : path(name.m_pathname.c_str() + pos);
  }